

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::CleanTestOutput
          (cmCTestTestHandler *this,string *output,size_t length,TruncationMode truncate)

{
  char *last;
  bool bVar1;
  char cVar2;
  long lVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  size_type *psVar8;
  char cVar9;
  _Alloc_hider _Var10;
  pointer first;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string __str;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  pointer local_38;
  
  if (length == 0) {
    return;
  }
  if (output->_M_string_length <= length) {
    return;
  }
  lVar3 = std::__cxx11::string::find((char *)output,0x741f55,0);
  if (lVar3 != -1) {
    return;
  }
  cVar9 = '\x01';
  if (9 < length) {
    sVar7 = length;
    cVar2 = '\x04';
    do {
      cVar9 = cVar2;
      if (sVar7 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_001d6d67;
      }
      if (sVar7 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_001d6d67;
      }
      if (sVar7 < 10000) goto LAB_001d6d67;
      bVar1 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar2 = cVar9 + '\x04';
    } while (bVar1);
    cVar9 = cVar9 + '\x01';
  }
LAB_001d6d67:
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_78._M_dataplus._M_p,(uint)local_78._M_string_length,length);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x744fd8);
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_98.field_2._M_allocated_capacity = *psVar8;
    local_98.field_2._8_8_ = plVar4[3];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar8;
    local_98._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_98._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_58.field_2._M_allocated_capacity = *psVar8;
    local_58.field_2._8_8_ = plVar4[3];
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar8;
    local_58._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_58._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  first = (output->_M_dataplus)._M_p;
  last = first + output->_M_string_length;
  if (truncate == Middle) {
    pcVar12 = first + (length >> 1);
    local_38 = first;
    do {
      if (pcVar12 <= first) break;
      pcVar5 = cm_utf8_decode_character(first,last,(uint *)&local_98);
      pcVar13 = first + 1;
      if (pcVar5 <= pcVar12) {
        first = pcVar5;
      }
      if (pcVar5 == (char *)0x0) {
        first = pcVar13;
      }
    } while (pcVar5 <= pcVar12);
    uVar11 = (long)first - (long)local_38;
    std::__cxx11::string::erase((ulong)output,uVar11);
    std::operator+(&local_78,"...",&local_58);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = plVar4[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_98._M_string_length = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::replace((ulong)output,uVar11,(char *)0x0,(ulong)local_98._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    _Var10._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_001d70ad;
  }
  else {
    if (truncate == Head) {
      pcVar12 = first + (output->_M_string_length - length);
      do {
        if (pcVar12 <= first) break;
        pcVar5 = cm_utf8_decode_character(first,last,(uint *)&local_98);
        pcVar13 = first + 1;
        if (pcVar5 <= pcVar12) {
          first = pcVar5;
        }
        if (pcVar5 == (char *)0x0) {
          first = pcVar13;
        }
      } while (pcVar5 <= pcVar12);
      std::__cxx11::string::erase((ulong)output,0);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,local_58._M_dataplus._M_p,
                 local_58._M_dataplus._M_p + local_58._M_string_length);
      std::__cxx11::string::append((char *)&local_98);
      std::__cxx11::string::replace((ulong)output,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
    }
    else {
      pcVar13 = first + length;
      pcVar12 = first;
      do {
        if (pcVar13 <= pcVar12) break;
        pcVar6 = cm_utf8_decode_character(pcVar12,last,(uint *)&local_98);
        pcVar5 = pcVar12 + 1;
        if (pcVar6 <= pcVar13) {
          pcVar12 = pcVar6;
        }
        if (pcVar6 == (char *)0x0) {
          pcVar12 = pcVar5;
        }
      } while (pcVar6 <= pcVar13);
      uVar11 = (long)pcVar12 - (long)first;
      if (output->_M_string_length < uVar11) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                   uVar11);
      }
      output->_M_string_length = uVar11;
      (output->_M_dataplus)._M_p[uVar11] = '\0';
      std::operator+(&local_98,"...",&local_58);
      std::__cxx11::string::_M_append((char *)output,(ulong)local_98._M_dataplus._M_p);
    }
    local_78.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    _Var10._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_001d70ad;
  }
  operator_delete(_Var10._M_p,local_78.field_2._M_allocated_capacity + 1);
LAB_001d70ad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestTestHandler::CleanTestOutput(std::string& output, size_t length,
                                         cmCTestTypes::TruncationMode truncate)
{
  if (!length || length >= output.size() ||
      output.find("CTEST_FULL_OUTPUT") != std::string::npos) {
    return;
  }

  // Advance n bytes in string delimited by begin/end but do not break in the
  // middle of a multi-byte UTF-8 encoding.
  auto utf8_advance = [](char const* const begin, char const* const end,
                         size_t n) -> const char* {
    char const* const stop = begin + n;
    char const* current = begin;
    while (current < stop) {
      unsigned int ch;
      if (const char* next = cm_utf8_decode_character(current, end, &ch)) {
        if (next > stop) {
          break;
        }
        current = next;
      } else // Bad byte will be handled by cmXMLWriter.
      {
        ++current;
      }
    }
    return current;
  };

  // Truncation message.
  const std::string msg =
    "\n[This part of the test output was removed since it "
    "exceeds the threshold of " +
    std::to_string(length) + " bytes.]\n";

  char const* const begin = output.c_str();
  char const* const end = begin + output.size();

  // Erase head, middle or tail of output.
  if (truncate == cmCTestTypes::TruncationMode::Head) {
    char const* current = utf8_advance(begin, end, output.size() - length);
    output.erase(0, current - begin);
    output.insert(0, msg + "...");
  } else if (truncate == cmCTestTypes::TruncationMode::Middle) {
    char const* current = utf8_advance(begin, end, length / 2);
    output.erase(current - begin, output.size() - length);
    output.insert(current - begin, "..." + msg + "...");
  } else { // default or "tail"
    char const* current = utf8_advance(begin, end, length);
    output.erase(current - begin);
    output += ("..." + msg);
  }
}